

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O3

void __thiscall
cpprofiler::Connector::start(Connector *this,string *file_path,int execution_id,bool has_restarts)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  string base_name;
  string info;
  stringstream ss;
  char *local_218;
  long local_210;
  char local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_218 = local_208;
  pcVar1 = (file_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar1,pcVar1 + file_path->_M_string_length);
  lVar2 = std::__cxx11::string::rfind((char)&local_218,0x2f);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_218);
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"has_restarts\": ",0x10);
  pcVar4 = "false";
  if (has_restarts) {
    pcVar4 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar4,(ulong)has_restarts ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\"name\": ",9);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_218,local_210);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (execution_id != -1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\"execution_id\": ",0x11);
    std::ostream::operator<<((ostream *)local_1a8,execution_id);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_1f8,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  (this->marshalling).msg._have_label = false;
  (this->marshalling).msg._have_nogood = false;
  (this->marshalling).msg._type = START;
  (this->marshalling).msg._have_version = true;
  (this->marshalling).msg._version = 3;
  (this->marshalling).msg._have_info = true;
  std::__cxx11::string::_M_assign((string *)&(this->marshalling).msg._info);
  sendOverSocket(this);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0]);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  return;
}

Assistant:

void start(const std::string& file_path = "",
               int execution_id = -1, bool has_restarts = false) {
    /// extract fzn file name
    std::string base_name(file_path);
    {
      size_t pos = base_name.find_last_of('/');
      if (pos != static_cast<size_t>(-1)) {
        base_name = base_name.substr(pos + 1, base_name.length() - pos - 1);
      }
    }

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"has_restarts\": " << (has_restarts ? "true" : "false")  << "\n";
      ss << ",\"name\": " << "\"" << base_name << "\"" << "\n";
      if (execution_id != -1) {
        ss << ",\"execution_id\": " << execution_id;
      }
      ss << "}";
      info = ss.str();
    }

    marshalling.makeStart(info);
    sendOverSocket();
  }